

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O0

CProgram * parseCodeWithLex(string *testfile_name)

{
  ostream *poVar1;
  char *__filename;
  CProgram *local_18;
  CProgram *cProgram;
  string *testfile_name_local;
  
  line_number = 1;
  column_number = 1;
  cProgram = (CProgram *)testfile_name;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Processing: ");
  poVar1 = std::operator<<(poVar1,(string *)cProgram);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  __filename = (char *)std::__cxx11::string::c_str();
  yyin = (FILE *)fopen(__filename,"r");
  yyrestart(yyin);
  yyparse(&local_18);
  fclose((FILE *)yyin);
  return local_18;
}

Assistant:

CProgram *parseCodeWithLex( const std::string &testfile_name ) {
    CProgram *cProgram;
    line_number = 1;
    column_number = 1;
    std::cout << std::endl << "Processing: " << testfile_name << std::endl;
    yyin = fopen( testfile_name.c_str( ), "r" );
    yyrestart( yyin );
    yyparse( &cProgram );
    fclose( yyin );

    return cProgram;
}